

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distorm.c
# Opt level: O2

void distorm_format_signed_disp(uchar **str,_DInst *di,uint64_t addrMask)

{
  uint64_t x;
  
  if (di->dispSize != '\0') {
    if ((long)di->disp < 0) {
      **str = '-';
      x = -di->disp & addrMask;
    }
    else {
      **str = '+';
      x = di->disp;
    }
    *str = *str + 1;
    str_int_impl(str,x);
    return;
  }
  return;
}

Assistant:

static void distorm_format_signed_disp(unsigned char** str, const _DInst* di, uint64_t addrMask)
{
	int64_t tmpDisp64;

	if (di->dispSize) {
		if (((int64_t)di->disp < 0)) {
			chrcat_WS(*str, MINUS_DISP_CHR);
			tmpDisp64 = -(int64_t)di->disp;
			tmpDisp64 &= addrMask; /* Verify only for neg numbers. */
		}
		else {
			chrcat_WS(*str, PLUS_DISP_CHR);
			tmpDisp64 = di->disp;
		}
		str_int(str, tmpDisp64);
	}
}